

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

iterator __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
emplace<slang::IntervalMapDetails::Path::Entry>
          (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this,const_iterator pos,
          Entry *args)

{
  pointer pEVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  iterator pEVar4;
  reference pEVar5;
  iterator pEVar6;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *in_RDX;
  pointer in_RSI;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *in_RDI;
  Entry temp;
  iterator result;
  Entry *in_stack_ffffffffffffff88;
  pointer __first;
  Entry *in_stack_ffffffffffffffd0;
  size_type sVar7;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    local_8 = emplaceRealloc<slang::IntervalMapDetails::Path::Entry>
                        (in_RDX,in_RSI,in_stack_ffffffffffffffd0);
  }
  else {
    __first = in_RSI;
    pEVar4 = end(in_RDI);
    if (in_RSI == pEVar4) {
      pEVar4 = end(in_RDI);
      pEVar4->node = in_RDX->data_;
      uVar2 = *(undefined4 *)((long)&in_RDX->len + 4);
      pEVar4->size = *(undefined4 *)&in_RDX->len;
      pEVar4->offset = uVar2;
      in_RDI->len = in_RDI->len + 1;
      local_8 = __first;
    }
    else {
      pEVar1 = in_RDX->data_;
      sVar7 = in_RDX->len;
      pEVar4 = end(in_RDI);
      pEVar5 = back(in_RDI);
      pEVar4->node = pEVar5->node;
      uVar3 = pEVar5->offset;
      pEVar4->size = pEVar5->size;
      pEVar4->offset = uVar3;
      local_8 = __first;
      pEVar6 = end(in_RDI);
      pEVar6 = pEVar6 + -1;
      end(in_RDI);
      std::ranges::__move_backward_fn::
      operator()<slang::IntervalMapDetails::Path::Entry_*,_slang::IntervalMapDetails::Path::Entry_*,_slang::IntervalMapDetails::Path::Entry_*>
                ((__move_backward_fn *)pEVar6,__first,pEVar4,in_stack_ffffffffffffff88);
      local_8->node = pEVar1;
      local_8->size = (int)sVar7;
      local_8->offset = (int)(sVar7 >> 0x20);
      in_RDI->len = in_RDI->len + 1;
    }
  }
  return local_8;
}

Assistant:

iterator emplace(const_iterator pos, Args&&... args) {
        auto result = const_cast<iterator>(pos);
        if (len == cap)
            return emplaceRealloc(result, std::forward<Args>(args)...);

        if (pos == end()) {
            // Emplace at end can be constructed in place.
            new (end()) T(std::forward<Args>(args)...);
            len++;
            return result;
        }

        // Construct a temporary to avoid aliasing an existing element we're about to move.
        T temp(std::forward<Args>(args)...);

        // Manually move the last element backward by one because it's uninitialized space.
        new (end()) T(std::move(back()));

        // Now move everything else and insert our temporary.
        std::ranges::move_backward(result, end() - 1, end());
        *result = std::move(temp);

        len++;
        return result;
    }